

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_WriteCountExpr_Test::TestBody(ExprWriterTest_WriteCountExpr_Test *this)

{
  ExprFactory *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  Reference lhs;
  NumericConstant rhs;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args;
  char *message;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  string local_88;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_68;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_38;
  undefined1 local_30 [16];
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  lhs = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  rhs = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,EQ,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  lhs.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  rhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  args = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_38;
  uVar1 = (this->super_ExprWriterTest).l0;
  uVar2 = (this->super_ExprWriterTest).l1;
  local_30._8_4_ = (int)uVar1;
  local_30._0_8_ = uVar2;
  local_30._12_4_ = (int)((ulong)uVar1 >> 0x20);
  local_68.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.size_ = 3;
  local_68.data_ = (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)args;
  local_a0.data_ =
       (AssertHelperData *)ExprWriterTest::MakeCount(&this->super_ExprWriterTest,&local_68);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_88,(fmt *)0x14e4d3,(CStringRef)&local_a0,args);
  testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"count(x1 = 0, 1, 0)\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeCount(args)))",
             (char (*) [20])"count(x1 = 0, 1, 0)",&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                   *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteCountExpr) {
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1, l0
  };
  CHECK_WRITE("count(x1 = 0, 1, 0)", MakeCount(args));
}